

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O3

_Bool history_add_full(player *p,bitflag *type,wchar_t aidx,wchar_t place,wchar_t clev,
                      wchar_t turnno,char *text)

{
  size_t *psVar1;
  history_info *phVar2;
  size_t sVar3;
  
  phVar2 = (p->hist).entries;
  if (phVar2 == (history_info *)0x0) {
    (p->hist).next = 0;
    (p->hist).length = 0x14;
    phVar2 = (history_info *)mem_zalloc(0x730);
  }
  else {
    sVar3 = (p->hist).next;
    if (sVar3 != (p->hist).length) goto LAB_001b912d;
    sVar3 = sVar3 + 0x14;
    (p->hist).length = sVar3;
    phVar2 = (history_info *)mem_realloc(phVar2,sVar3 * 0x5c);
  }
  (p->hist).entries = phVar2;
LAB_001b912d:
  flag_copy(phVar2[(p->hist).next].type,type,2);
  phVar2 = (p->hist).entries;
  sVar3 = (p->hist).next;
  phVar2[sVar3].place = (int16_t)place;
  phVar2[sVar3].clev = (int16_t)clev;
  phVar2[sVar3].a_idx = (uint8_t)aidx;
  phVar2[sVar3].turn = turnno;
  my_strcpy(phVar2[sVar3].event,text,0x50);
  psVar1 = &(p->hist).next;
  *psVar1 = *psVar1 + 1;
  return true;
}

Assistant:

bool history_add_full(struct player *p,
		bitflag *type,
		int aidx,
		int place,
		int clev,
		int turnno,
		const char *text)
{
	struct player_history *h = &p->hist;

	/* Allocate or expand the history list if needed */
	if (!h->entries)
		history_init(h);
	else if (h->next == h->length)
		history_realloc(h);

	/* Add entry */
	hist_copy(h->entries[h->next].type, type);
	h->entries[h->next].place = place;
	h->entries[h->next].clev = clev;
	h->entries[h->next].a_idx = aidx;
	h->entries[h->next].turn = turnno;
	my_strcpy(h->entries[h->next].event,
			text,
			sizeof(h->entries[h->next].event));

	h->next++;

	return true;
}